

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O3

Gia_Man_t * Ssc_PerformSweepingInt(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  Gia_Rpr_t GVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  Ssc_Pars_t *pSVar7;
  int iVar8;
  uint uVar9;
  Ssc_Man_t *pSVar10;
  Gia_Man_t *pGVar11;
  Gia_Man_t *p;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  uint uVar19;
  long lVar20;
  timespec ts;
  timespec local_68;
  Ssc_Man_t *local_58;
  Ssc_Pars_t *local_50;
  Gia_Obj_t *local_48;
  undefined8 *local_40;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_68);
  if (iVar8 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar8 = clock_gettime(3,&local_68);
  if (iVar8 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (pCare->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCare) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x110,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  if (pAig->vCis->nSize != pCare->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x111,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar8 = Gia_ManIsNormalized(pAig);
  if (iVar8 == 0) {
    __assert_fail("Gia_ManIsNormalized(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x112,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar8 = Gia_ManIsNormalized(pCare);
  if (iVar8 == 0) {
    __assert_fail("Gia_ManIsNormalized(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x113,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  Gia_ManRandom(1);
  pSVar10 = Ssc_ManStart(pAig,pCare,pPars);
  if (pSVar10 == (Ssc_Man_t *)0x0) {
    pGVar11 = Gia_ManDup(pAig);
  }
  else if (pSVar10 == (Ssc_Man_t *)0x1) {
    pGVar11 = Gia_ManDupZero(pAig);
  }
  else {
    if (pSVar10->pPars->fVerbose != 0) {
      uVar9 = Ssc_GiaEstimateCare(pSVar10->pFraig,5);
      printf("Care set produced %d hits out of %d.\n",(ulong)uVar9,0x280);
    }
    do {
      Ssc_GiaRandomPiPattern(pSVar10->pFraig,5,(Vec_Int_t *)0x0);
      Ssc_GiaSimRound(pSVar10->pFraig);
      iVar8 = Ssc_GiaTransferPiPattern(pAig,pSVar10->pFraig,pSVar10->vPivot);
      if (iVar8 == 0) break;
      Ssc_GiaSimRound(pAig);
      iVar8 = Ssc_GiaClassesRefine(pAig);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      iVar1 = pAig->vCis->nSize;
    } while ((iVar1 + pAig->nObjs + ~(pAig->vCos->nSize + iVar1)) / 100 < iVar8);
    iVar8 = clock_gettime(3,&local_68);
    if (iVar8 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    pSVar10->timeSimInit = pSVar10->timeSimInit + lVar13 + lVar12;
    local_38 = lVar20;
    Gia_ManFillValue(pAig);
    pGVar5 = pAig->pObjs;
    pGVar5->Value = 0;
    lVar20 = (long)pAig->vCis->nSize;
    if (0 < lVar20) {
      piVar6 = pAig->vCis->pArray;
      lVar12 = 0;
      do {
        iVar8 = piVar6[lVar12];
        if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_005be4ba;
        pGVar11 = pSVar10->pFraig;
        if (pGVar11->vCis->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pGVar11->vCis->pArray[lVar12];
        if (((long)iVar1 < 0) || (pGVar11->nObjs <= iVar1)) goto LAB_005be4ba;
        pGVar16 = pGVar11->pObjs;
        pGVar18 = (Gia_Obj_t *)((ulong)(pGVar16 + iVar1) & 0xfffffffffffffffe);
        if ((pGVar18 < pGVar16) || (pGVar16 + (uint)pGVar11->nObjs <= pGVar18)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar17 = (int)((ulong)((long)pGVar18 - (long)pGVar16) >> 2);
        if (iVar17 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        pGVar5[iVar8].Value = ((uint)(pGVar16 + iVar1) & 1) + iVar17 * 0x55555556;
        lVar12 = lVar12 + 1;
      } while (lVar20 != lVar12);
    }
    Gia_ManHashStart(pSVar10->pFraig);
    local_50 = pPars;
    Ssc_GiaResetPiPattern(pAig,pPars->nWords);
    local_58 = pSVar10;
    Ssc_GiaSavePiPattern(pAig,pSVar10->vPivot);
    if (0 < pAig->nObjs) {
      lVar12 = 0;
      lVar20 = 0;
      do {
        pGVar5 = pAig->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar15 = *(ulong *)(&pGVar5->field_0x0 + lVar12);
        uVar9 = (uint)(uVar15 & 0x1fffffff);
        if (((~(uint)uVar15 & 0x9fffffff) == 0) ||
           (-1 < (int)(uint)uVar15 && (uVar15 & 0x1fffffff) != 0x1fffffff)) {
          if (pAig->iPatsPi == local_50->nWords << 6) {
            iVar8 = clock_gettime(3,&local_68);
            if (iVar8 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_68.tv_sec * -1000000;
            }
            Ssc_GiaSimRound(pAig);
            Ssc_GiaClassesRefine(pAig);
            if (local_50->fVerbose != 0) {
              Gia_ManEquivPrintClasses(pAig,0,0.0);
            }
            pSVar10 = local_58;
            Ssc_GiaClassesCheckPairs(pAig,local_58->vDisPairs);
            pSVar10->vDisPairs->nSize = 0;
            Ssc_GiaResetPiPattern(pAig,local_50->nWords);
            Ssc_GiaSavePiPattern(pAig,pSVar10->vPivot);
            iVar8 = clock_gettime(3,&local_68);
            if (iVar8 < 0) {
              lVar14 = -1;
            }
            else {
              lVar14 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
            }
            local_58->timeSimSat = local_58->timeSimSat + lVar14 + lVar13;
            uVar15 = *(ulong *)(&pGVar5->field_0x0 + lVar12);
            uVar9 = (uint)uVar15 & 0x1fffffff;
          }
          if ((-1 < (int)uVar15) && (uVar9 != 0x1fffffff)) {
            uVar9 = *(uint *)((long)pGVar5 + lVar12 + (ulong)(uVar9 << 2) * -3 + 8);
            if (((int)uVar9 < 0) ||
               (uVar2 = *(uint *)((long)pGVar5 +
                                 lVar12 + (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3 + 8),
               (int)uVar2 < 0)) goto LAB_005be536;
            iVar8 = Gia_ManHashAnd(local_58->pFraig,uVar9 ^ (uint)(uVar15 >> 0x1d) & 1,
                                   uVar2 ^ (uint)(uVar15 >> 0x3d) & 1);
            *(int *)((long)&pGVar5->Value + lVar12) = iVar8;
          }
          GVar3 = pAig->pReprs[lVar20];
          uVar15 = (ulong)(uint)GVar3 & 0xfffffff;
          if (uVar15 != 0xfffffff) {
            if (pAig->nObjs <= (int)uVar15) {
LAB_005be4ba:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar16 = pAig->pObjs;
            uVar9 = pGVar16[uVar15].Value;
            if ((int)uVar9 < 0) {
LAB_005be536:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            uVar2 = *(uint *)((long)&pGVar5->Value + lVar12);
            uVar19 = ((uint)((ulong)*(undefined8 *)(&pGVar5->field_0x0 + lVar12) >> 0x20) ^
                     (uint)((ulong)*(undefined8 *)(pGVar16 + uVar15) >> 0x20)) >> 0x1f;
            if (uVar2 == (uVar9 ^ uVar19)) {
              pAig->pReprs[lVar20] = (Gia_Rpr_t)((uint)GVar3 | 0x10000000);
            }
            else {
              if ((int)uVar2 < 0) {
LAB_005be555:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              local_48 = pGVar16;
              local_40 = (undefined8 *)(uVar15 * 3);
              if ((uVar9 ^ uVar2) < 2) {
                __assert_fail("Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                              ,0x157,
                              "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                             );
              }
              iVar8 = clock_gettime(3,&local_68);
              if (iVar8 < 0) {
                pGVar16 = (Gia_Obj_t *)0x1;
              }
              else {
                lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
                pGVar16 = (Gia_Obj_t *)
                          (((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_68.tv_sec * -1000000);
              }
              local_58->nSatCalls = local_58->nSatCalls + 1;
              local_40 = (undefined8 *)(&local_48->field_0x0 + (long)local_40 * 4);
              if (((int)*(uint *)(local_40 + 1) < 0) ||
                 (uVar4 = *(uint *)((long)&pGVar5->Value + lVar12), local_48 = pGVar16,
                 (int)uVar4 < 0)) goto LAB_005be555;
              iVar8 = Ssc_ManCheckEquivalence
                                (local_58,*(uint *)(local_40 + 1) >> 1,uVar4 >> 1,
                                 (uVar9 ^ uVar2) & 1 ^ uVar19);
              pSVar10 = local_58;
              if (iVar8 == 1) {
                local_58->nSatCallsSat = local_58->nSatCallsSat + 1;
                Ssc_GiaSavePiPattern(pAig,local_58->vPattern);
                Vec_IntPush(pSVar10->vDisPairs,(uint)pSVar10->pAig->pReprs[lVar20] & 0xfffffff);
                Vec_IntPush(pSVar10->vDisPairs,(int)lVar20);
                uVar9 = (uint)pSVar10->pAig->pReprs[lVar20] & 0xfffffff;
                if (uVar9 != 0) {
                  Ssc_GiaResimulateOneClass(pSVar10,uVar9,(int)lVar20);
                }
              }
              else if (iVar8 == 0) {
                local_58->nSatCallsUndec = local_58->nSatCallsUndec + 1;
              }
              else {
                if (iVar8 != -1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                                ,0x171,
                                "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                               );
                }
                local_58->nSatCallsUnsat = local_58->nSatCallsUnsat + 1;
                if ((int)*(uint *)(local_40 + 1) < 0) goto LAB_005be536;
                *(uint *)((long)&pGVar5->Value + lVar12) =
                     *(uint *)(local_40 + 1) ^
                     ((uint)((ulong)*(undefined8 *)(&pGVar5->field_0x0 + lVar12) >> 0x20) ^
                     (uint)((ulong)*local_40 >> 0x20)) >> 0x1f;
                pAig->pReprs[lVar20] = (Gia_Rpr_t)((uint)pAig->pReprs[lVar20] | 0x10000000);
              }
              iVar8 = clock_gettime(3,&local_68);
              if (iVar8 < 0) {
                lVar13 = -1;
              }
              else {
                lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
              }
              pSVar10->timeSat = (abctime)(&local_48->field_0x0 + pSVar10->timeSat + lVar13);
            }
          }
        }
        lVar20 = lVar20 + 1;
        lVar12 = lVar12 + 0xc;
      } while (lVar20 < pAig->nObjs);
    }
    lVar20 = local_38;
    pSVar10 = local_58;
    if (1 < pAig->iPatsPi) {
      iVar8 = clock_gettime(3,&local_68);
      pSVar7 = local_50;
      if (iVar8 < 0) {
        lVar12 = 1;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      while (pAig->iPatsPi < pSVar7->nWords * 0x40) {
        Ssc_GiaSavePiPattern(pAig,pSVar10->vPivot);
      }
      Ssc_GiaSimRound(pAig);
      Ssc_GiaClassesRefine(pAig);
      if (pSVar7->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Ssc_GiaClassesCheckPairs(pAig,pSVar10->vDisPairs);
      pSVar10->vDisPairs->nSize = 0;
      iVar8 = clock_gettime(3,&local_68);
      if (iVar8 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      pSVar10->timeSimSat = pSVar10->timeSimSat + lVar13 + lVar12;
    }
    p = Gia_ManEquivReduce(pAig,0,0,1,0);
    if (p == (Gia_Man_t *)0x0) {
      puts("There is no equivalences.");
      if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
        free(pAig->pReprs);
        pAig->pReprs = (Gia_Rpr_t *)0x0;
      }
      if (pAig->pNexts != (int *)0x0) {
        free(pAig->pNexts);
        pAig->pNexts = (int *)0x0;
      }
      p = Gia_ManDup(pAig);
    }
    pGVar11 = Gia_ManCleanup(p);
    Gia_ManStop(p);
    iVar8 = clock_gettime(3,&local_68);
    pSVar7 = local_50;
    if (iVar8 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    pSVar10->timeTotal = lVar12 - lVar20;
    if (local_50->fVerbose != 0) {
      Ssc_ManPrintStats(pSVar10);
    }
    Ssc_ManStop(pSVar10);
    if (pSVar7->fVerbose != 0) {
      Abc_Print(1,"Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ",
                100.0 - ((double)(~(pGVar11->vCos->nSize + pGVar11->vCis->nSize) + pGVar11->nObjs) *
                        100.0) / (double)(~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs));
      iVar8 = clock_gettime(3,&local_68);
      if (iVar8 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(1,"%s =","Time");
      Abc_Print(1,"%9.2f sec\n",(double)(lVar12 - lVar20) / 1000000.0);
    }
  }
  return pGVar11;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingInt( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    Gia_Man_t * pResult, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    abctime clk, clkTotal = Abc_Clock();
    int i, fCompl, nRefined, status;
clk = Abc_Clock();
    assert( Gia_ManRegNum(pCare) == 0 );
    assert( Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare) );
    assert( Gia_ManIsNormalized(pAig) );
    assert( Gia_ManIsNormalized(pCare) );
    // reset random numbers
    Gia_ManRandom( 1 );
    // sweeping manager
    p = Ssc_ManStart( pAig, pCare, pPars );
    if ( p == (Ssc_Man_t *)(ABC_PTRINT_T)1 ) // UNSAT
        return Gia_ManDupZero( pAig );
    if ( p == NULL ) // timeout
        return Gia_ManDup( pAig );
    if ( p->pPars->fVerbose )
        printf( "Care set produced %d hits out of %d.\n", Ssc_GiaEstimateCare(p->pFraig, 5), 640 );
    // perform simulation 
    while ( 1 ) 
    {
        // simulate care set
        Ssc_GiaRandomPiPattern( p->pFraig, 5, NULL );
        Ssc_GiaSimRound( p->pFraig );
        // transfer care patterns to user's AIG
        if ( !Ssc_GiaTransferPiPattern( pAig, p->pFraig, p->vPivot ) )
            break;
        // simulate the main AIG
        Ssc_GiaSimRound( pAig );
        nRefined = Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        if ( nRefined <= Gia_ManCandNum(pAig) / 100 )
            break;
    }
p->timeSimInit += Abc_Clock() - clk;

    // prepare user's AIG
    Gia_ManFillValue(pAig);
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_Obj2Lit( p->pFraig, Gia_ManCi(p->pFraig, i) );
//    Gia_ManLevelNum(pAig);
    // prepare swept AIG (should be done after starting SAT solver in Ssc_ManStart)
    Gia_ManHashStart( p->pFraig );
    // perform sweeping
    Ssc_GiaResetPiPattern( pAig, pPars->nWords );
    Ssc_GiaSavePiPattern( pAig, p->vPivot );
    Gia_ManForEachCand( pAig, pObj, i )
    {
        if ( pAig->iPatsPi == 64 * pPars->nWords )
        {
clk = Abc_Clock();
            Ssc_GiaSimRound( pAig );
            Ssc_GiaClassesRefine( pAig );
            if ( pPars->fVerbose ) 
                Gia_ManEquivPrintClasses( pAig, 0, 0 );
            Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
            Vec_IntClear( p->vDisPairs );
            // prepare next patterns
            Ssc_GiaResetPiPattern( pAig, pPars->nWords );
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
p->timeSimSat += Abc_Clock() - clk;
//printf( "\n" );
        }
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pFraig, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Gia_ObjHasRepr(pAig, i) )
            continue;
        pRepr = Gia_ObjReprObj(pAig, i);
        if ( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase ) )
        {
            Gia_ObjSetProved( pAig, i );
            continue;
        }
        assert( Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value) );
        fCompl = pRepr->fPhase ^ pObj->fPhase ^ Abc_LitIsCompl(pRepr->Value) ^ Abc_LitIsCompl(pObj->Value);

        // perform SAT call
clk = Abc_Clock();
        p->nSatCalls++;
        status = Ssc_ManCheckEquivalence( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
            Gia_ObjSetProved( pAig, i );
        }
        else if ( status == l_True )
        {
            p->nSatCallsSat++;
            Ssc_GiaSavePiPattern( pAig, p->vPattern );
            Vec_IntPush( p->vDisPairs, Gia_ObjRepr(p->pAig, i) );
            Vec_IntPush( p->vDisPairs, i );
//            printf( "Try %2d and %2d: ", Gia_ObjRepr(p->pAig, i), i );
//            Vec_IntPrint( p->vPattern );
            if ( Gia_ObjRepr(p->pAig, i) > 0 )
                Ssc_GiaResimulateOneClass( p, Gia_ObjRepr(p->pAig, i), i );
        }
        else if ( status == l_Undef )
            p->nSatCallsUndec++;
        else assert( 0 );
p->timeSat += Abc_Clock() - clk;
    }
    if ( pAig->iPatsPi > 1 )
    {
clk = Abc_Clock();
        while ( pAig->iPatsPi < 64 * pPars->nWords )
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
        Ssc_GiaSimRound( pAig );
        Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
        Vec_IntClear( p->vDisPairs );
p->timeSimSat += Abc_Clock() - clk;
    }
//    Gia_ManEquivPrintClasses( pAig, 1, 0 );
//    Gia_ManPrint( pAig );

    // generate the resulting AIG
    pResult = Gia_ManEquivReduce( pAig, 0, 0, 1, 0 );
    if ( pResult == NULL )
    {
        printf( "There is no equivalences.\n" );
        ABC_FREE( pAig->pReprs );
        ABC_FREE( pAig->pNexts );
        pResult = Gia_ManDup( pAig );
    }
    pResult = Gia_ManCleanup( pTemp = pResult );
    Gia_ManStop( pTemp );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( pPars->fVerbose )
        Ssc_ManPrintStats( p );
    Ssc_ManStop( p );
    // count the number of representatives
    if ( pPars->fVerbose ) 
    {
        Abc_Print( 1, "Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pResult), 
            100.0 - 100.0 * Gia_ManAndNum(pResult) / Gia_ManAndNum(pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    return pResult;
}